

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::Texture2DSizeCase::init(Texture2DSizeCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  Texture2D *this_00;
  uint uVar3;
  int levelNdx;
  long lVar4;
  undefined1 *local_50;
  float afStack_48 [2];
  Vec4 local_40;
  
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  iVar1 = 1;
  if (this->m_useMipmaps == true) {
    uVar2 = this->m_height;
    if (this->m_height < this->m_width) {
      uVar2 = this->m_width;
    }
    uVar3 = 0x20;
    if (uVar2 != 0) {
      uVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar1 = 0x20 - uVar3;
  }
  if (iVar1 != 0) {
    uVar2 = iVar1 << 3;
    lVar4 = 0;
    levelNdx = 0;
    do {
      tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,levelNdx);
      local_40.m_data[0] = -1.0;
      local_40.m_data[1] = -1.0;
      local_40.m_data[2] = -1.0;
      local_40.m_data[3] = 2.0;
      local_50 = &DAT_3f8000003f800000;
      afStack_48[0] = 1.0;
      afStack_48[1] = 0.0;
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 ((long)(((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_size.m_data + lVar4 + -8),&local_40,(Vec4 *)&local_50);
      levelNdx = levelNdx + 1;
      lVar4 = lVar4 + 0x28;
      iVar1 = extraout_EAX;
    } while ((ulong)uVar2 * 5 != lVar4);
  }
  return iVar1;
}

Assistant:

void Texture2DSizeCase::init (void)
{
	DE_ASSERT(!m_texture);
	m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = m_useMipmaps ? deLog2Floor32(de::max(m_width, m_height))+1 : 1;

	// Fill levels.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(levelNdx), tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
	}
}